

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walEncodeFrame(Wal *pWal,u32 iPage,u32 nTruncate,u8 *aData,u8 *aFrame)

{
  uint nativeCksum_00;
  u32 *aIn;
  u32 *aCksum;
  int nativeCksum;
  u8 *aFrame_local;
  u8 *aData_local;
  u32 nTruncate_local;
  u32 iPage_local;
  Wal *pWal_local;
  
  aIn = (pWal->hdr).aFrameCksum;
  sqlite3Put4byte(aFrame,iPage);
  sqlite3Put4byte(aFrame + 4,nTruncate);
  if (pWal->iReCksum == 0) {
    *(undefined8 *)(aFrame + 8) = *(undefined8 *)(pWal->hdr).aSalt;
    nativeCksum_00 = (uint)((pWal->hdr).bigEndCksum == '\0');
    walChecksumBytes(nativeCksum_00,aFrame,8,aIn,aIn);
    walChecksumBytes(nativeCksum_00,aData,pWal->szPage,aIn,aIn);
    sqlite3Put4byte(aFrame + 0x10,*aIn);
    sqlite3Put4byte(aFrame + 0x14,(pWal->hdr).aFrameCksum[1]);
  }
  else {
    memset(aFrame + 8,0,0x10);
  }
  return;
}

Assistant:

static void walEncodeFrame(
  Wal *pWal,                      /* The write-ahead log */
  u32 iPage,                      /* Database page number for frame */
  u32 nTruncate,                  /* New db size (or 0 for non-commit frames) */
  u8 *aData,                      /* Pointer to page data */
  u8 *aFrame                      /* OUT: Write encoded frame here */
){
  int nativeCksum;                /* True for native byte-order checksums */
  u32 *aCksum = pWal->hdr.aFrameCksum;
  assert( WAL_FRAME_HDRSIZE==24 );
  sqlite3Put4byte(&aFrame[0], iPage);
  sqlite3Put4byte(&aFrame[4], nTruncate);
  if( pWal->iReCksum==0 ){
    memcpy(&aFrame[8], pWal->hdr.aSalt, 8);

    nativeCksum = (pWal->hdr.bigEndCksum==SQLITE_BIGENDIAN);
    walChecksumBytes(nativeCksum, aFrame, 8, aCksum, aCksum);
    walChecksumBytes(nativeCksum, aData, pWal->szPage, aCksum, aCksum);

    sqlite3Put4byte(&aFrame[16], aCksum[0]);
    sqlite3Put4byte(&aFrame[20], aCksum[1]);
  }else{
    memset(&aFrame[8], 0, 16);
  }
}